

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O0

void __thiscall
QOpenGL2PaintEngineExPrivate::transferMode(QOpenGL2PaintEngineExPrivate *this,EngineMode newMode)

{
  QOpenGLPoint *pQVar1;
  int in_ESI;
  long in_RDI;
  undefined8 in_stack_ffffffffffffffd8;
  GLuint GVar2;
  GLfloat *in_stack_ffffffffffffffe0;
  uint in_stack_fffffffffffffff0;
  
  GVar2 = (GLuint)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  if (in_ESI != *(int *)(in_RDI + 600)) {
    if (in_ESI == 1) {
      QOpenGLEngineShaderManager::setHasComplexGeometry
                (*(QOpenGLEngineShaderManager **)(in_RDI + 0x230),true);
    }
    else {
      QOpenGLEngineShaderManager::setHasComplexGeometry
                (*(QOpenGLEngineShaderManager **)(in_RDI + 0x230),false);
    }
    if (in_ESI == 0) {
      uploadData((QOpenGL2PaintEngineExPrivate *)(ulong)in_stack_fffffffffffffff0,
                 (uint)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffe0,GVar2);
      uploadData((QOpenGL2PaintEngineExPrivate *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                 (uint)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffe0,GVar2);
    }
    if ((in_ESI == 3) || (in_ESI == 4)) {
      pQVar1 = QOpenGL2PEXVertexArray::data((QOpenGL2PEXVertexArray *)0x15edd1);
      GVar2 = (GLuint)((ulong)pQVar1 >> 0x20);
      QOpenGL2PEXVertexArray::vertexCount((QOpenGL2PEXVertexArray *)0x15ede7);
      uploadData((QOpenGL2PaintEngineExPrivate *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                 (uint)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffe0,GVar2);
      pQVar1 = QOpenGL2PEXVertexArray::data((QOpenGL2PEXVertexArray *)0x15ee0d);
      QOpenGL2PEXVertexArray::vertexCount((QOpenGL2PEXVertexArray *)0x15ee23);
      uploadData((QOpenGL2PaintEngineExPrivate *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                 (uint)((ulong)in_RDI >> 0x20),&pQVar1->x,GVar2);
      if (in_ESI == 4) {
        QDataBuffer<float>::data((QDataBuffer<float> *)(in_RDI + 0x368));
        QDataBuffer<float>::size((QDataBuffer<float> *)(in_RDI + 0x368));
        uploadData((QOpenGL2PaintEngineExPrivate *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                   (uint)((ulong)in_RDI >> 0x20),&pQVar1->x,GVar2);
      }
    }
    if (in_ESI != 1) {
      QOpenGLEngineShaderManager::setMaskType
                (*(QOpenGLEngineShaderManager **)(in_RDI + 0x230),NoMask);
    }
    *(int *)(in_RDI + 600) = in_ESI;
  }
  return;
}

Assistant:

void QOpenGL2PaintEngineExPrivate::transferMode(EngineMode newMode)
{
    if (newMode == mode)
        return;

    if (newMode == TextDrawingMode) {
        shaderManager->setHasComplexGeometry(true);
    } else {
        shaderManager->setHasComplexGeometry(false);
    }

    if (newMode == ImageDrawingMode) {
        uploadData(QT_VERTEX_COORDS_ATTR, staticVertexCoordinateArray, 8);
        uploadData(QT_TEXTURE_COORDS_ATTR, staticTextureCoordinateArray, 8);
    }

    if (newMode == ImageArrayDrawingMode || newMode == ImageOpacityArrayDrawingMode) {
        uploadData(QT_VERTEX_COORDS_ATTR, (GLfloat*)vertexCoordinateArray.data(), vertexCoordinateArray.vertexCount() * 2);
        uploadData(QT_TEXTURE_COORDS_ATTR, (GLfloat*)textureCoordinateArray.data(), textureCoordinateArray.vertexCount() * 2);

        if (newMode == ImageOpacityArrayDrawingMode)
            uploadData(QT_OPACITY_ATTR, (GLfloat*)opacityArray.data(), opacityArray.size());
    }

    // This needs to change when we implement high-quality anti-aliasing...
    if (newMode != TextDrawingMode)
        shaderManager->setMaskType(QOpenGLEngineShaderManager::NoMask);

    mode = newMode;
}